

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall aeron::ClientConductor::onClientTimeout(ClientConductor *this,int64_t clientId)

{
  longlong now;
  char *pcVar1;
  ClientTimeoutException exception;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  SourcedException local_50;
  
  if ((this->m_driverProxy->m_clientId == clientId) && (((this->m_isClosed)._M_base._M_i & 1U) == 0)
     ) {
    now = std::function<long_long_()>::operator()(&this->m_epochClock);
    closeAllResources(this,now);
    std::__cxx11::string::string((string *)&local_70,"client timeout from driver",&local_b1);
    std::__cxx11::string::string
              ((string *)&local_90,"void aeron::ClientConductor::onClientTimeout(std::int64_t)",
               &local_b2);
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                              );
    std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b3);
    util::ClientTimeoutException::ClientTimeoutException
              ((ClientTimeoutException *)&local_50,&local_70,&local_90,&local_b0,0x2cc);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::function<void_(const_std::exception_&)>::operator()
              (&this->m_errorHandler,&local_50.super_exception);
    util::SourcedException::~SourcedException(&local_50);
  }
  return;
}

Assistant:

void ClientConductor::onClientTimeout(std::int64_t clientId)
{
    if (m_driverProxy.clientId() == clientId && !isClosed())
    {
        const long long now = m_epochClock();

        closeAllResources(now);

        ClientTimeoutException exception("client timeout from driver", SOURCEINFO);
        m_errorHandler(exception);
    }
}